

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::MILSpec::TensorValue_RepeatedBytes::InternalSwap
          (TensorValue_RepeatedBytes *this,TensorValue_RepeatedBytes *other)

{
  Arena *rhs_arena_00;
  Arena *lhs_arena_00;
  string *default_value;
  Arena *rhs_arena;
  Arena *lhs_arena;
  TensorValue_RepeatedBytes *other_local;
  TensorValue_RepeatedBytes *this_local;
  
  rhs_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  lhs_arena_00 = google::protobuf::MessageLite::GetArenaForAllocation(&other->super_MessageLite);
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  default_value = google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::InternalSwap
            (default_value,&this->values_,rhs_arena_00,&other->values_,lhs_arena_00);
  return;
}

Assistant:

void TensorValue_RepeatedBytes::InternalSwap(TensorValue_RepeatedBytes* other) {
  using std::swap;
  auto* lhs_arena = GetArenaForAllocation();
  auto* rhs_arena = other->GetArenaForAllocation();
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  ::PROTOBUF_NAMESPACE_ID::internal::ArenaStringPtr::InternalSwap(
      &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
      &values_, lhs_arena,
      &other->values_, rhs_arena
  );
}